

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O3

int ORPG::Core::getopt_long(int argc,char **argv,char *optstring,option *longopts,int *index)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  option *poVar9;
  int iVar10;
  char *pcVar11;
  char *__s;
  int iVar12;
  char *local_60;
  
  if (optstring == (char *)0x0) {
    return -1;
  }
  if (optind == 0) {
    optreset = 1;
    optind = 1;
  }
  iVar2 = getopt_internal(argc,argv,optstring);
  iVar10 = optind;
  if (iVar2 != -2) {
    return iVar2;
  }
  lVar7 = (long)optind;
  optind = optind + 1;
  if (argv[lVar7][2] == '\0') {
    return -1;
  }
  __s = argv[lVar7] + 2;
  local_60 = strchr(__s,0x3d);
  if (local_60 == (char *)0x0) {
    sVar5 = strlen(__s);
    uVar3 = (uint)sVar5;
    local_60 = (char *)0x0;
  }
  else {
    uVar3 = (int)local_60 - (int)__s;
    local_60 = local_60 + 1;
  }
  pcVar11 = longopts->name;
  if (pcVar11 != (char *)0x0) {
    poVar9 = longopts + 1;
    iVar2 = -1;
    iVar12 = 0;
    do {
      iVar4 = strncmp(__s,pcVar11,(long)(int)uVar3);
      if (iVar4 == 0) {
        sVar5 = strlen(pcVar11);
        if (sVar5 == uVar3) goto LAB_00102a7b;
        if (iVar2 == -1) {
          iVar2 = iVar12;
        }
      }
      pcVar11 = poVar9->name;
      iVar12 = iVar12 + 1;
      poVar9 = poVar9 + 1;
    } while (pcVar11 != (char *)0x0);
    iVar12 = iVar2;
    if (iVar2 != -1) {
LAB_00102a7b:
      __stream = _stderr;
      if (longopts[iVar12].has_arg - 1U < 2) {
        if (local_60 == (char *)0x0) {
          optind = iVar10 + 2;
          optarg = argv[lVar7 + 1];
          if ((longopts[iVar12].has_arg == 1) && (optarg == (char *)0x0)) {
            cVar1 = *optstring;
            if (opterr != 0) {
              if (cVar1 == ':') {
                return 0x3a;
              }
              pcVar11 = *argv;
              pcVar6 = strrchr(pcVar11,0x2f);
              pcVar8 = pcVar6 + 1;
              if (pcVar6 == (char *)0x0) {
                pcVar8 = pcVar11;
              }
              fprintf(__stream,"%s: option requires an argument -- %s\n",pcVar8,__s);
              cVar1 = *optstring;
            }
            if (cVar1 == ':') {
              return 0x3a;
            }
            return 0x3f;
          }
        }
        else {
          optarg = local_60;
        }
      }
      iVar10 = longopts[iVar12].val;
      if (longopts[iVar12].flag != (int *)0x0) {
        *longopts[iVar12].flag = iVar10;
        iVar10 = 0;
      }
      if (index != (int *)0x0) {
        *index = iVar12;
        return iVar10;
      }
      return iVar10;
    }
  }
  if ((opterr != 0) && (*optstring != ':')) {
    getopt_long();
  }
  return 0x3f;
}

Assistant:

int getopt_long(int argc, char* argv[],
                        const char* optstring,
                        const struct option* longopts,
                        int* index) {
            if(optstring == NULL)
                return EOF;

            /* lets make sure we don't
            check the program name */
            if(optind == 0)
                optind = optreset = 1;

            int retval = EOF;

            if ((retval = getopt_internal(argc, argv, optstring)) == CONTINUE_CODE) {
                char *current_argv = argv[optind++] + 2, *has_equal;
                int i, current_argv_len, match = EOF;

                /* Check to make sure we have not reached a null ('\0') terminator*/
                if (*current_argv == '\0') return EOF;

                /* if our option has a '=' after it (i.e openrpg --roll=5d6)
                then do not count it in our length */
                if ((has_equal = strchr(current_argv, '=')) != NULL) {
                    current_argv_len = has_equal - current_argv;
                    has_equal++;
                } else
                    current_argv_len = strlen(current_argv);

                /* Check if our current option is in our list of longopts */
                for (i = 0; longopts[i].name; i++) {

                    /* Move though the list until we find a match */
                    if (strncmp(current_argv, longopts[i].name, current_argv_len))
                        continue;

                    if (strlen(longopts[i].name) == (unsigned)current_argv_len) {
                        match = i;

                        break;
                    }

                    /* something has gone wrong if we get here*/
                    if (match == EOF) match = i;
                }

                /* if we found a match then lets check if it has an argument */
                if (match != EOF) {
                    /* there could be an arguement! */
                    if (longopts[match].has_arg == required_argument ||
                        longopts[match].has_arg == optional_argument) {

                        /* if there was an equal ('=') then lets move to it
                        otherwise just increment by 1 */
                        if (has_equal)
                            optarg = has_equal;
                        else
                            optarg = argv[optind++];
                    }

                    /* if an argument is required lets make sure we have it*/
                    if ((longopts[match].has_arg == required_argument)
                        && (optarg == NULL)) {
                        /*
                        * Missing argument, leading :
                        * indicates no error should be generated
                        */
                        if ((opterr) && (*optstring != ':'))
                            fprintf(stderr,
                                    "%s: option requires an argument -- %s\n",
                                    program_name(argv[0]),
                                    current_argv);
                        return (((*optstring == ':') ? BADARG : BADCHAR));
                    }
                } else {
                    /* No matching argument */
                    if ((opterr) && (*optstring != ':'))
                        fprintf(stderr,
                                "%s: illegal option -- %s\n",
                                program_name(argv[0]),
                                current_argv);
                    return BADCHAR;
                }

                if (longopts[match].flag) {
                    *longopts[match].flag = longopts[match].val;
                    retval = 0;
                } else
                    retval = longopts[match].val;

                if (index)
                    *index = match;
            }

            return retval;
        }